

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  int *piVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  uint uVar12;
  void *pvVar13;
  void *pvVar14;
  undefined4 *puVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  undefined8 *puVar19;
  undefined1 (*pauVar20) [32];
  int nn;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  undefined8 *puVar23;
  undefined1 (*pauVar24) [32];
  undefined4 *puVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  undefined4 *puVar30;
  ulong uVar31;
  undefined4 *puVar32;
  long lVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 local_b8 [64];
  size_t local_78;
  Mat *local_70;
  Mat *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar31 = (ulong)(int)uVar2;
  iVar16 = bottom_im2col->h;
  uVar9 = bottom_im2col->c;
  uVar11 = (ulong)uVar9;
  local_60 = (ulong)top_blob->c;
  local_78 = 0;
  local_b8._0_8_ = (void *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = 0;
  local_b8._24_4_ = 0;
  local_b8._32_8_ = (Allocator *)0x0;
  local_b8._40_4_ = 0;
  local_b8._44_4_ = 0;
  local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar31 < 4) {
    uVar7 = uVar2;
    iVar26 = iVar16;
    if (1 < (int)uVar2) {
      iVar26 = iVar16 * 2;
      uVar7 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar7 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar26 = iVar16 * 4;
  }
  local_70 = top_blob;
  local_68 = kernel;
  Mat::create((Mat *)local_b8,iVar26,uVar9,uVar7,8,8,(Allocator *)opt);
  uVar7 = (int)uVar2 >> 2;
  if (0 < (int)uVar7) {
    lVar17 = 0;
    uVar18 = 0;
    do {
      if (0 < (int)uVar9) {
        pauVar20 = (undefined1 (*) [32])(local_78 * uVar18 * local_b8._16_8_ + local_b8._0_8_);
        uVar21 = 0;
        do {
          if (0 < iVar16) {
            pauVar24 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar21 + lVar17);
            iVar26 = iVar16;
            do {
              *pauVar20 = *pauVar24;
              pauVar20 = pauVar20 + 1;
              pauVar24 = (undefined1 (*) [32])(*pauVar24 + (ulong)uVar2 * 8);
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar11);
      }
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar18 != uVar7);
  }
  uVar12 = uVar2 >> 1 & 1;
  if ((uVar12 != 0) && (0 < (int)uVar9)) {
    pauVar10 = (undefined1 (*) [16])((long)(int)uVar7 * local_78 * local_b8._16_8_ + local_b8._0_8_)
    ;
    uVar18 = 0;
    do {
      if (0 < iVar16) {
        pauVar22 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar18 +
                   (uVar31 & 0xfffffffffffffffc) * 8);
        iVar26 = iVar16;
        do {
          *pauVar10 = *pauVar22;
          pauVar10 = pauVar10 + 1;
          pauVar22 = (undefined1 (*) [16])(*pauVar22 + uVar31 * 8);
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar11);
  }
  iVar26 = (int)(uVar31 & 0xfffffffffffffffc) + uVar12 * 2;
  if (iVar26 < (int)uVar2) {
    uVar18 = (ulong)iVar26;
    pvVar13 = (void *)(uVar18 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar9) {
        iVar8 = (int)uVar18;
        iVar26 = iVar8 + 3;
        if (-1 < iVar8) {
          iVar26 = iVar8;
        }
        puVar19 = (undefined8 *)
                  ((long)(int)((int)((char)((char)uVar18 - ((byte)iVar26 & 0xfc)) / '\x02') +
                              (iVar26 >> 2) +
                              (iVar8 - (((uint)(uVar18 >> 0x1f) & 1) + iVar8 & 0xfffffffe))) *
                   local_78 * local_b8._16_8_ + local_b8._0_8_);
        uVar21 = 0;
        do {
          if (0 < iVar16) {
            puVar23 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar21 + (long)pvVar13);
            iVar26 = iVar16;
            do {
              *puVar19 = *puVar23;
              puVar19 = puVar19 + 1;
              puVar23 = puVar23 + uVar31;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar11);
      }
      uVar18 = uVar18 + 1;
      pvVar13 = (void *)((long)pvVar13 + 8);
    } while ((long)uVar18 < (long)uVar31);
  }
  uVar7 = (int)local_60 >> 2;
  if (0 < (int)uVar7) {
    local_40 = local_70->data;
    local_48 = local_70->cstep * local_70->elemsize;
    pvVar13 = local_68->data;
    local_50 = local_68->cstep * local_68->elemsize;
    iVar26 = uVar9 * iVar16;
    local_58 = (ulong)uVar7;
    lVar17 = local_78 * local_b8._16_8_;
    uVar11 = 0;
    do {
      local_38 = uVar11;
      puVar30 = (undefined4 *)(local_38 * 4 * local_48 + (long)local_40);
      puVar32 = (undefined4 *)((local_38 * 4 + 1) * local_48 + (long)local_40);
      puVar15 = (undefined4 *)((local_38 * 4 + 2) * local_48 + (long)local_40);
      puVar25 = (undefined4 *)((local_38 * 4 + 3) * local_48 + (long)local_40);
      if ((int)uVar2 < 4) {
        uVar11 = 0;
      }
      else {
        uVar18 = 0;
        pvVar14 = (void *)local_b8._0_8_;
        do {
          if (iVar26 < 1) {
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar42 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar59 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar56 = ZEXT1664((undefined1  [16])0x0);
            lVar29 = 0;
            auVar60 = ZEXT1664((undefined1  [16])0x0);
            auVar57 = ZEXT1664((undefined1  [16])0x0);
            auVar61 = ZEXT1664((undefined1  [16])0x0);
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            iVar8 = iVar26;
            do {
              auVar36 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar14 + lVar29));
              auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar13 + lVar29));
              auVar51 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar13 + lVar29 + 0x10));
              auVar44 = vpmullw_avx2(auVar54,auVar36);
              auVar59 = vpmulhw_avx2(auVar36,auVar54);
              auVar49 = vpermq_avx2(auVar36,0x4e);
              auVar45 = vpmullw_avx2(auVar49,auVar54);
              auVar41 = vpmulhw_avx2(auVar49,auVar54);
              auVar34 = vpmullw_avx512vl(auVar51,auVar36);
              auVar42 = vpmulhw_avx2(auVar36,auVar51);
              auVar35 = vpmullw_avx512vl(auVar49,auVar51);
              auVar49 = vpmulhw_avx2(auVar49,auVar51);
              auVar36 = vpunpcklwd_avx512vl(auVar44,auVar59);
              auVar37 = vpaddd_avx512vl(auVar56._0_32_,auVar36);
              auVar36 = vpunpcklwd_avx512vl(auVar45,auVar41);
              auVar38 = vpaddd_avx512vl(auVar60._0_32_,auVar36);
              auVar36 = vpunpcklwd_avx512vl(auVar34,auVar42);
              auVar39 = vpaddd_avx512vl(auVar57._0_32_,auVar36);
              auVar36 = vpunpcklwd_avx512vl(auVar35,auVar49);
              auVar40 = vpaddd_avx512vl(auVar61._0_32_,auVar36);
              auVar36 = vpunpckhwd_avx2(auVar44,auVar59);
              auVar36 = vpaddd_avx2(auVar36,auVar37);
              auVar56 = ZEXT3264(auVar36);
              auVar59 = vpunpckhwd_avx2(auVar45,auVar41);
              auVar59 = vpaddd_avx2(auVar59,auVar38);
              auVar60 = ZEXT3264(auVar59);
              auVar41 = vpunpckhwd_avx512vl(auVar34,auVar42);
              auVar41 = vpaddd_avx2(auVar41,auVar39);
              auVar57 = ZEXT3264(auVar41);
              auVar42 = vpunpckhwd_avx512vl(auVar35,auVar49);
              auVar49 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar14 + lVar29 + 0x10));
              auVar42 = vpaddd_avx2(auVar42,auVar40);
              auVar61 = ZEXT3264(auVar42);
              auVar38 = vpmullw_avx2(auVar49,auVar54);
              auVar45 = vpmulhw_avx2(auVar49,auVar54);
              auVar44 = vpermq_avx2(auVar49,0x4e);
              auVar39 = vpmullw_avx2(auVar44,auVar54);
              auVar34 = vpmulhw_avx2(auVar44,auVar54);
              auVar40 = vpmullw_avx2(auVar49,auVar51);
              auVar35 = vpmulhw_avx2(auVar49,auVar51);
              auVar43 = vpmullw_avx512vl(auVar44,auVar51);
              auVar37 = vpmulhw_avx2(auVar44,auVar51);
              auVar54 = vpunpcklwd_avx2(auVar38,auVar45);
              auVar54 = vpaddd_avx2(auVar54,auVar55._0_32_);
              auVar51 = vpunpcklwd_avx2(auVar39,auVar34);
              auVar51 = vpaddd_avx2(auVar51,auVar52._0_32_);
              auVar49 = vpunpcklwd_avx2(auVar40,auVar35);
              auVar49 = vpaddd_avx2(auVar49,auVar50._0_32_);
              auVar44 = vpunpcklwd_avx512vl(auVar43,auVar37);
              auVar44 = vpaddd_avx2(auVar44,auVar48._0_32_);
              auVar45 = vpunpckhwd_avx2(auVar38,auVar45);
              auVar54 = vpaddd_avx2(auVar45,auVar54);
              auVar55 = ZEXT3264(auVar54);
              auVar45 = vpunpckhwd_avx2(auVar39,auVar34);
              auVar51 = vpaddd_avx2(auVar45,auVar51);
              auVar52 = ZEXT3264(auVar51);
              auVar45 = vpunpckhwd_avx2(auVar40,auVar35);
              auVar49 = vpaddd_avx2(auVar45,auVar49);
              auVar50 = ZEXT3264(auVar49);
              auVar45 = vpunpckhwd_avx512vl(auVar43,auVar37);
              auVar44 = vpaddd_avx2(auVar45,auVar44);
              auVar48 = ZEXT3264(auVar44);
              lVar29 = lVar29 + 0x20;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
          auVar45 = vpunpckldq_avx2(auVar36,auVar59);
          auVar34 = vpunpckldq_avx2(auVar41,auVar42);
          auVar59 = vpunpckhdq_avx2(auVar36,auVar59);
          auVar41 = vpunpckhdq_avx2(auVar41,auVar42);
          auVar42 = vpunpcklqdq_avx2(auVar45,auVar34);
          auVar36 = vpunpckhqdq_avx2(auVar45,auVar34);
          auVar36 = vpaddd_avx2(auVar42,auVar36);
          auVar42 = vpunpcklqdq_avx2(auVar59,auVar41);
          auVar59 = vpunpckhqdq_avx2(auVar59,auVar41);
          auVar59 = vpaddd_avx2(auVar59,auVar42);
          auVar36 = vpaddd_avx2(auVar36,auVar59);
          auVar59 = vpunpckldq_avx2(auVar54,auVar51);
          auVar45 = vpunpckldq_avx2(auVar49,auVar44);
          auVar41 = vpunpckhdq_avx2(auVar54,auVar51);
          auVar42 = vpunpckhdq_avx2(auVar49,auVar44);
          auVar54 = vpunpcklqdq_avx2(auVar59,auVar45);
          auVar59 = vpunpckhqdq_avx2(auVar59,auVar45);
          auVar59 = vpaddd_avx2(auVar54,auVar59);
          auVar54 = vpunpcklqdq_avx2(auVar41,auVar42);
          *puVar30 = auVar36._0_4_;
          *puVar32 = auVar36._20_4_;
          auVar41 = vpunpckhqdq_avx2(auVar41,auVar42);
          *puVar15 = auVar36._8_4_;
          auVar41 = vpaddd_avx2(auVar41,auVar54);
          *puVar25 = auVar36._28_4_;
          auVar59 = vpaddd_avx2(auVar59,auVar41);
          puVar30[1] = auVar36._4_4_;
          puVar32[1] = auVar36._16_4_;
          puVar15[1] = auVar36._12_4_;
          puVar25[1] = auVar36._24_4_;
          puVar30[2] = auVar59._0_4_;
          puVar32[2] = auVar59._20_4_;
          puVar15[2] = auVar59._8_4_;
          puVar25[2] = auVar59._28_4_;
          puVar30[3] = auVar59._4_4_;
          puVar32[3] = auVar59._16_4_;
          puVar15[3] = auVar59._12_4_;
          puVar25[3] = auVar59._24_4_;
          puVar30 = puVar30 + 4;
          puVar32 = puVar32 + 4;
          puVar15 = puVar15 + 4;
          puVar25 = puVar25 + 4;
          uVar11 = uVar18 + 4;
          lVar29 = uVar18 + 7;
          pvVar14 = (void *)((long)pvVar14 + lVar17);
          uVar18 = uVar11;
        } while (lVar29 < (long)uVar31);
      }
      uVar7 = (uint)uVar11;
      if ((int)(uVar7 | 1) < (int)uVar2) {
        uVar12 = 0;
        do {
          iVar8 = (int)uVar11;
          if (iVar26 < 1) {
            auVar42 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar59 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            lVar29 = 0;
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            iVar27 = iVar26;
            do {
              auVar36 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        (local_b8._0_8_ +
                                        lVar29 + (ulong)((uVar12 & 1) +
                                                        ((uint)(uVar11 >> 2) & 0x3fffffff)) * lVar17
                                        ));
              auVar59 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar13 + lVar29 * 2));
              auVar41 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar13 + lVar29 * 2 + 0x10));
              auVar45 = vpmullw_avx2(auVar59,auVar36);
              auVar54 = vpmulhw_avx2(auVar36,auVar59);
              auVar42 = vpermq_avx2(auVar36,0x4e);
              auVar34 = vpmullw_avx2(auVar42,auVar59);
              auVar51 = vpmulhw_avx2(auVar42,auVar59);
              auVar35 = vpmullw_avx2(auVar41,auVar36);
              auVar49 = vpmulhw_avx2(auVar36,auVar41);
              auVar37 = vpmullw_avx2(auVar42,auVar41);
              auVar44 = vpmulhw_avx2(auVar42,auVar41);
              auVar36 = vpunpcklwd_avx2(auVar45,auVar54);
              auVar36 = vpaddd_avx2(auVar36,auVar48._0_32_);
              auVar59 = vpunpcklwd_avx2(auVar34,auVar51);
              auVar59 = vpaddd_avx2(auVar59,auVar55._0_32_);
              auVar41 = vpunpcklwd_avx2(auVar35,auVar49);
              auVar41 = vpaddd_avx2(auVar41,auVar52._0_32_);
              auVar42 = vpunpcklwd_avx2(auVar37,auVar44);
              auVar42 = vpaddd_avx2(auVar42,auVar50._0_32_);
              auVar54 = vpunpckhwd_avx2(auVar45,auVar54);
              auVar36 = vpaddd_avx2(auVar36,auVar54);
              auVar48 = ZEXT3264(auVar36);
              auVar54 = vpunpckhwd_avx2(auVar34,auVar51);
              auVar59 = vpaddd_avx2(auVar59,auVar54);
              auVar55 = ZEXT3264(auVar59);
              auVar54 = vpunpckhwd_avx2(auVar35,auVar49);
              auVar41 = vpaddd_avx2(auVar41,auVar54);
              auVar52 = ZEXT3264(auVar41);
              auVar54 = vpunpckhwd_avx2(auVar37,auVar44);
              auVar42 = vpaddd_avx2(auVar42,auVar54);
              auVar50 = ZEXT3264(auVar42);
              lVar29 = lVar29 + 0x10;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          auVar54 = vpunpckldq_avx2(auVar36,auVar59);
          auVar51 = vpunpckldq_avx2(auVar41,auVar42);
          auVar59 = vpunpckhdq_avx2(auVar36,auVar59);
          auVar41 = vpunpckhdq_avx2(auVar41,auVar42);
          auVar42 = vpunpcklqdq_avx2(auVar54,auVar51);
          auVar36 = vpunpckhqdq_avx2(auVar54,auVar51);
          auVar36 = vpaddd_avx2(auVar42,auVar36);
          auVar42 = vpunpcklqdq_avx2(auVar59,auVar41);
          auVar59 = vpunpckhqdq_avx2(auVar59,auVar41);
          auVar59 = vpaddd_avx2(auVar59,auVar42);
          auVar36 = vpaddd_avx2(auVar36,auVar59);
          *puVar30 = auVar36._0_4_;
          *puVar32 = auVar36._20_4_;
          *puVar15 = auVar36._8_4_;
          *puVar25 = auVar36._28_4_;
          puVar30[1] = auVar36._4_4_;
          puVar32[1] = auVar36._16_4_;
          puVar15[1] = auVar36._12_4_;
          puVar25[1] = auVar36._24_4_;
          puVar30 = puVar30 + 2;
          puVar32 = puVar32 + 2;
          puVar15 = puVar15 + 2;
          puVar25 = puVar25 + 2;
          uVar7 = iVar8 + 2;
          uVar12 = (uint)(byte)((char)uVar12 + 1);
          uVar11 = (ulong)uVar7;
        } while (iVar8 + 3 < (int)uVar2);
      }
      if ((int)uVar7 < (int)uVar2) {
        do {
          if (iVar26 < 1) {
            auVar59 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            lVar29 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            iVar8 = iVar26;
            do {
              auVar47._8_8_ = 0;
              auVar47._0_8_ =
                   *(ulong *)(local_b8._0_8_ +
                             lVar29 + (ulong)((uVar7 & 1) + (uVar7 >> 2) +
                                             (uint)((uVar7 >> 1 & 1) != 0)) * lVar17);
              auVar47 = vpmovsxbw_avx(auVar47);
              auVar36 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar13 + lVar29 * 4));
              auVar59 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar13 + lVar29 * 4 + 0x10));
              auVar42._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar47;
              auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar47
              ;
              auVar54 = vpmullw_avx2(auVar42,auVar36);
              auVar41 = vpmulhw_avx2(auVar42,auVar36);
              auVar51 = vpmullw_avx2(auVar42,auVar59);
              auVar42 = vpmulhw_avx2(auVar42,auVar59);
              auVar36 = vpunpcklwd_avx2(auVar54,auVar41);
              auVar36 = vpaddd_avx2(auVar48._0_32_,auVar36);
              auVar59 = vpunpcklwd_avx2(auVar51,auVar42);
              auVar59 = vpaddd_avx2(auVar50._0_32_,auVar59);
              auVar41 = vpunpckhwd_avx2(auVar54,auVar41);
              auVar36 = vpaddd_avx2(auVar36,auVar41);
              auVar48 = ZEXT3264(auVar36);
              auVar41 = vpunpckhwd_avx2(auVar51,auVar42);
              auVar59 = vpaddd_avx2(auVar59,auVar41);
              auVar50 = ZEXT3264(auVar59);
              lVar29 = lVar29 + 8;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
          auVar47 = vpunpckldq_avx(auVar36._0_16_,auVar36._16_16_);
          auVar53 = vpunpckldq_avx(auVar59._0_16_,auVar59._16_16_);
          auVar58 = vpunpckhdq_avx(auVar36._0_16_,auVar36._16_16_);
          auVar46 = vpunpckhdq_avx(auVar59._0_16_,auVar59._16_16_);
          auVar5 = vpunpcklqdq_avx(auVar47,auVar53);
          auVar47 = vpunpckhqdq_avx(auVar47,auVar53);
          auVar47 = vpaddd_avx(auVar5,auVar47);
          auVar53 = vpunpcklqdq_avx(auVar58,auVar46);
          auVar58 = vpunpckhqdq_avx(auVar58,auVar46);
          auVar58 = vpaddd_avx(auVar58,auVar53);
          auVar47 = vpaddd_avx(auVar47,auVar58);
          *puVar30 = auVar47._0_4_;
          *puVar32 = auVar47._4_4_;
          *puVar15 = auVar47._8_4_;
          *puVar25 = auVar47._12_4_;
          puVar30 = puVar30 + 1;
          puVar32 = puVar32 + 1;
          puVar15 = puVar15 + 1;
          puVar25 = puVar25 + 1;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar2);
      }
      pvVar13 = (void *)((long)pvVar13 + local_50);
      uVar11 = local_38 + 1;
    } while (local_38 + 1 != local_58);
  }
  uVar11 = local_60 & 0xfffffffffffffffc;
  if ((int)uVar11 != (int)local_60) {
    pvVar13 = local_70->data;
    sVar3 = local_70->cstep;
    sVar4 = local_70->elemsize;
    lVar17 = local_78 * local_b8._16_8_;
    pvVar14 = local_68->data;
    lVar29 = local_68->cstep * local_68->elemsize;
    iVar16 = iVar16 * uVar9;
    do {
      pauVar10 = (undefined1 (*) [16])(sVar3 * sVar4 * uVar11 + (long)pvVar13);
      uVar9 = (uint)uVar11;
      if ((int)uVar2 < 4) {
        uVar18 = 0;
      }
      else {
        uVar7 = uVar9 + 3;
        if (-1 < (int)uVar9) {
          uVar7 = uVar9;
        }
        uVar21 = 0;
        do {
          if (iVar16 < 1) {
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar59 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar22 = (undefined1 (*) [16])((uVar21 >> 2) * lVar17 + local_b8._0_8_);
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            lVar33 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar36 = vpmovsxbw_avx2(*pauVar22);
              auVar59 = vpmovsxbw_avx2(pauVar22[1]);
              auVar58._8_8_ = 0;
              auVar58._0_8_ =
                   *(ulong *)((long)pvVar14 +
                             lVar33 * 8 +
                             (int)(((int)uVar7 >> 2) + (uVar9 - (uVar7 & 0xfffffffc))) * lVar29);
              auVar41 = vpmovsxbw_avx2(auVar58);
              auVar42 = vpermq_avx2(auVar41,0x44);
              auVar54 = vpmullw_avx2(auVar42,auVar36);
              auVar41 = vpmulhw_avx2(auVar36,auVar42);
              auVar51 = vpmullw_avx2(auVar42,auVar59);
              auVar42 = vpmulhw_avx2(auVar59,auVar42);
              auVar36 = vpunpcklwd_avx2(auVar54,auVar41);
              auVar36 = vpaddd_avx2(auVar55._0_32_,auVar36);
              auVar55 = ZEXT3264(auVar36);
              auVar59 = vpunpckhwd_avx2(auVar54,auVar41);
              auVar59 = vpaddd_avx2(auVar52._0_32_,auVar59);
              auVar52 = ZEXT3264(auVar59);
              auVar41 = vpunpcklwd_avx2(auVar51,auVar42);
              auVar41 = vpaddd_avx2(auVar50._0_32_,auVar41);
              auVar50 = ZEXT3264(auVar41);
              auVar42 = vpunpckhwd_avx2(auVar51,auVar42);
              auVar42 = vpaddd_avx2(auVar48._0_32_,auVar42);
              auVar48 = ZEXT3264(auVar42);
              lVar33 = lVar33 + 1;
              pauVar22 = pauVar22 + 2;
            } while (iVar16 != (int)lVar33);
            auVar36 = vpaddd_avx2(auVar59,auVar36);
            auVar59 = vpaddd_avx2(auVar42,auVar41);
          }
          auVar47 = vpshufd_avx(auVar36._0_16_,0xee);
          auVar47 = vpaddd_avx(auVar47,auVar36._0_16_);
          auVar58 = vpshufd_avx(auVar36._16_16_,0xee);
          auVar58 = vpaddd_avx(auVar58,auVar36._16_16_);
          auVar58 = vphaddd_avx(auVar47,auVar58);
          auVar47 = vpshufd_avx(auVar59._0_16_,0xee);
          auVar47 = vpaddd_avx(auVar47,auVar59._0_16_);
          auVar46 = vphaddd_avx(auVar47,auVar47);
          auVar47 = vpshufd_avx(auVar59._16_16_,0xee);
          auVar47 = vpaddd_avx(auVar47,auVar59._16_16_);
          auVar47 = vphaddd_avx(auVar47,auVar47);
          auVar58 = vpshufd_avx(auVar58,0xe8);
          auVar58 = vpunpcklqdq_avx(auVar58,auVar46);
          auVar46._0_4_ = auVar47._0_4_;
          auVar46._4_4_ = auVar46._0_4_;
          auVar46._8_4_ = auVar46._0_4_;
          auVar46._12_4_ = auVar46._0_4_;
          auVar47 = vpblendd_avx2(auVar58,auVar46,8);
          *pauVar10 = auVar47;
          pauVar10 = pauVar10 + 1;
          uVar18 = uVar21 + 4;
          lVar33 = uVar21 + 7;
          uVar21 = uVar18;
        } while (lVar33 < (long)uVar31);
      }
      uVar7 = (uint)uVar18;
      if ((int)(uVar7 | 1) < (int)uVar2) {
        uVar12 = uVar9 + 3;
        if (-1 < (int)uVar9) {
          uVar12 = uVar9;
        }
        do {
          uVar28 = (uint)uVar18;
          if (iVar16 < 1) {
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar22 = (undefined1 (*) [16])
                       ((ulong)(((uint)(uVar18 >> 2) & 0x3fffffff) + (uint)((uVar28 >> 1 & 1) != 0))
                        * lVar17 + local_b8._0_8_);
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            lVar33 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar36 = vpmovsxbw_avx2(*pauVar22);
              auVar53._8_8_ = 0;
              auVar53._0_8_ =
                   *(ulong *)((long)pvVar14 +
                             lVar33 * 8 +
                             (int)(((int)uVar12 >> 2) + (uVar9 - (uVar12 & 0xfffffffc))) * lVar29);
              auVar59 = vpmovsxbw_avx2(auVar53);
              auVar59 = vpermq_avx2(auVar59,0x44);
              auVar41 = vpmullw_avx2(auVar59,auVar36);
              auVar59 = vpmulhw_avx2(auVar36,auVar59);
              auVar36 = vpunpcklwd_avx2(auVar41,auVar59);
              auVar36 = vpaddd_avx2(auVar50._0_32_,auVar36);
              auVar50 = ZEXT3264(auVar36);
              auVar59 = vpunpckhwd_avx2(auVar41,auVar59);
              auVar59 = vpaddd_avx2(auVar48._0_32_,auVar59);
              auVar48 = ZEXT3264(auVar59);
              pauVar22 = pauVar22 + 1;
              lVar33 = lVar33 + 1;
            } while (iVar16 != (int)lVar33);
            auVar36 = vpaddd_avx2(auVar59,auVar36);
          }
          auVar47 = vpshufd_avx(auVar36._0_16_,0xee);
          auVar47 = vpaddd_avx(auVar47,auVar36._0_16_);
          auVar58 = vpshufd_avx(auVar36._16_16_,0xee);
          auVar58 = vpaddd_avx(auVar58,auVar36._16_16_);
          auVar47 = vphaddd_avx(auVar47,auVar58);
          auVar47 = vpshufd_avx(auVar47,0xe8);
          *(long *)*pauVar10 = auVar47._0_8_;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
          uVar7 = uVar28 + 2;
          uVar18 = (ulong)uVar7;
        } while ((int)(uVar28 + 3) < (int)uVar2);
      }
      if ((int)uVar7 < (int)uVar2) {
        uVar12 = uVar9 + 3;
        if (-1 < (int)uVar9) {
          uVar12 = uVar9;
        }
        do {
          if (iVar16 < 1) {
            auVar47 = (undefined1  [16])0x0;
          }
          else {
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            lVar33 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(local_b8._0_8_ +
                                       lVar33 * 8 +
                                       (ulong)((uVar7 & 1) + (uVar7 >> 2) +
                                              (uint)((uVar7 >> 1 & 1) != 0)) * lVar17);
              auVar47 = vpmovsxbw_avx(auVar5);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)pvVar14 +
                                       lVar33 * 8 +
                                       (int)(((int)uVar12 >> 2) + (uVar9 - (uVar12 & 0xfffffffc))) *
                                       lVar29);
              auVar58 = vpmovsxbw_avx(auVar1);
              auVar46 = vpmullw_avx(auVar58,auVar47);
              auVar58 = vpmulhw_avx(auVar47,auVar58);
              auVar47 = vpunpcklwd_avx(auVar46,auVar58);
              auVar47 = vpaddd_avx(auVar50._0_16_,auVar47);
              auVar50 = ZEXT1664(auVar47);
              auVar58 = vpunpckhwd_avx(auVar46,auVar58);
              auVar58 = vpaddd_avx(auVar48._0_16_,auVar58);
              auVar48 = ZEXT1664(auVar58);
              lVar33 = lVar33 + 1;
            } while (iVar16 != (int)lVar33);
            auVar47 = vpaddd_avx(auVar58,auVar47);
          }
          auVar47 = vphaddd_avx(auVar47,auVar47);
          auVar47 = vphaddd_avx(auVar47,auVar47);
          *(int *)*pauVar10 = auVar47._0_4_;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar2);
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)local_60);
  }
  piVar6 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_b8._0_8_ != (void *)0x0) {
          free((void *)local_b8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                __m256i _sl04_15 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh04_15 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                __m256i _sl14_05 = _mm256_mullo_epi16(_val32_16, _w01_16);
                __m256i _sh14_05 = _mm256_mulhi_epi16(_val32_16, _w01_16);
                __m256i _sl06_17 = _mm256_mullo_epi16(_val23_16, _w23_16);
                __m256i _sh06_17 = _mm256_mulhi_epi16(_val23_16, _w23_16);
                __m256i _sl16_07 = _mm256_mullo_epi16(_val32_16, _w23_16);
                __m256i _sh16_07 = _mm256_mulhi_epi16(_val32_16, _w23_16);

                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpacklo_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpacklo_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpacklo_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpacklo_epi16(_sl16_07, _sh16_07));
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpackhi_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpackhi_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpackhi_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpackhi_epi16(_sl16_07, _sh16_07));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                __m256i _sl0_1 = _mm256_mullo_epi16(_valval, _w01_16);
                __m256i _sh0_1 = _mm256_mulhi_epi16(_valval, _w01_16);
                __m256i _sl2_3 = _mm256_mullo_epi16(_valval, _w23_16);
                __m256i _sh2_3 = _mm256_mulhi_epi16(_valval, _w23_16);

                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpacklo_epi16(_sl2_3, _sh2_3));
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpackhi_epi16(_sl2_3, _sh2_3));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
            __m256i _sum4_6 = _mm256_setzero_si256();
            __m256i _sum5_7 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl20_30 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh20_30 = _mm256_mulhi_epi16(_val23_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
                _sum4_6 = _mm256_add_epi32(_sum4_6, _mm256_unpacklo_epi16(_sl20_30, _sh20_30));
                _sum5_7 = _mm256_add_epi32(_sum5_7, _mm256_unpackhi_epi16(_sl20_30, _sh20_30));

                tmpptr += 32;
                kptr0 += 8;
            }

            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            _sum4_6 = _mm256_add_epi32(_sum4_6, _sum5_7);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
            __m128i _sum4 = _mm256_extracti128_si256(_sum4_6, 0);
            __m128i _sum6 = _mm256_extracti128_si256(_sum4_6, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0[2] = _mm_reduce_add_epi32(_sum4);
            outptr0[3] = _mm_reduce_add_epi32(_sum6);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl10, _sh10));
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
#else
            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 8;
                kptr0 += 8;
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}